

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O3

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  byte bVar1;
  size_t sVar2;
  uint32_or_64_or_128_t<unsigned_int> n_1;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  format_decimal_result<char_*> fVar6;
  char acStack_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  if (n < 1000) {
    uVar5 = (uint)(((ulong)n & 0xffff) >> 2) / 0x19;
    uVar3 = n + uVar5 * -100;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)uVar5 | 0x30;
    bVar1 = (byte)((uVar3 & 0xff) / 10);
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar3 + bVar1 * -10 | 0x30;
  }
  else {
    fVar6 = fmt::v9::detail::format_decimal<char,unsigned_int>(acStack_38,n,0x15);
    local_20 = fVar6.begin;
    if ((long)(acStack_38 + -(long)local_20) < -0x15) {
      fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,
               local_20 + (long)(acStack_38 + -(long)local_20 + 0x15));
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest) {
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000) {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    } else {
        append_int(n, dest);
    }
}